

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O0

void sptk::snack::xrwindow(float *din,float *dout,int n,float preemp)

{
  float *p;
  float preemp_local;
  int n_local;
  float *dout_local;
  float *din_local;
  
  if ((preemp != 0.0) || (n_local = n, dout_local = dout, din_local = din, NAN(preemp))) {
    p = din + 1;
    n_local = n;
    dout_local = dout;
    din_local = din;
    while (0 < n_local) {
      *dout_local = -preemp * *din_local + *p;
      p = p + 1;
      n_local = n_local + -1;
      dout_local = dout_local + 1;
      din_local = din_local + 1;
    }
  }
  else {
    while (0 < n_local) {
      *dout_local = *din_local;
      n_local = n_local + -1;
      dout_local = dout_local + 1;
      din_local = din_local + 1;
    }
  }
  return;
}

Assistant:

void xrwindow(float *din, float *dout, int n, float preemp)
#endif
{
  register float *p;
 
/* If preemphasis is to be performed,  this assumes that there are n+1 valid
   samples in the input buffer (din). */
  if(preemp != 0.0) {
    for( p=din+1; n-- > 0; )
      *dout++ = (float)((*p++) - (preemp * *din++));
  } else {
    for( ; n-- > 0; )
      *dout++ =  *din++;
  }
}